

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog_search_path.cpp
# Opt level: O1

string * duckdb::CatalogSearchEntry::WriteOptionallyQuoted
                   (string *__return_storage_ptr__,string *input)

{
  ulong uVar1;
  pointer pcVar2;
  long lVar3;
  long *plVar4;
  size_type *psVar5;
  ulong uVar6;
  bool bVar7;
  bool bVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  uVar1 = input->_M_string_length;
  bVar7 = uVar1 != 0;
  if (bVar7) {
    uVar6 = 1;
    do {
      if ((byte)((input->_M_dataplus)._M_p[uVar6 - 1] | 2U) == 0x2e) {
        ::std::operator+(&local_48,"\"",input);
        plVar4 = (long *)::std::__cxx11::string::append((char *)&local_48);
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        psVar5 = (size_type *)(plVar4 + 2);
        if ((size_type *)*plVar4 == psVar5) {
          lVar3 = plVar4[3];
          (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
          *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar3;
        }
        else {
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar4;
          (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
        }
        __return_storage_ptr__->_M_string_length = plVar4[1];
        *plVar4 = (long)psVar5;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_48._M_dataplus._M_p != &local_48.field_2) {
          operator_delete(local_48._M_dataplus._M_p);
        }
        if (bVar7) {
          return __return_storage_ptr__;
        }
        break;
      }
      bVar7 = uVar6 < uVar1;
      bVar8 = uVar6 != uVar1;
      uVar6 = uVar6 + 1;
    } while (bVar8);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar2 = (input->_M_dataplus)._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar2,pcVar2 + input->_M_string_length);
  return __return_storage_ptr__;
}

Assistant:

string CatalogSearchEntry::WriteOptionallyQuoted(const string &input) {
	for (idx_t i = 0; i < input.size(); i++) {
		if (input[i] == '.' || input[i] == ',') {
			return "\"" + input + "\"";
		}
	}
	return input;
}